

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashList_AddKVPair(ktxHashList *pHead,char *key,uint valueLen,void *value)

{
  UT_hash_bucket *pUVar1;
  UT_hash_table *pUVar2;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  ktxHashList pkVar8;
  UT_hash_table *pUVar9;
  UT_hash_bucket *pUVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  UT_hash_handle *pUVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  UT_hash_handle *pUVar18;
  uint uVar19;
  void *__dest;
  ktxHashList __dest_00;
  byte *pbVar20;
  uint uVar21;
  ktxHashList local_50;
  
  if (key == (char *)0x0 || pHead == (ktxHashList *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (valueLen != 0 && value == (void *)0x0) {
    return KTX_INVALID_VALUE;
  }
  sVar7 = strlen(key);
  if ((int)sVar7 == 0) {
    return KTX_INVALID_VALUE;
  }
  uVar21 = (int)sVar7 + 1;
  uVar17 = (ulong)uVar21;
  pkVar8 = (ktxHashList)malloc(valueLen + uVar17 + 0x58);
  __dest_00 = pkVar8 + 1;
  pkVar8->key = (char *)__dest_00;
  pkVar8->keyLen = uVar21;
  memcpy(__dest_00,key,uVar17);
  pkVar8->valueLen = valueLen;
  if (valueLen == 0) {
    pkVar8->value = (void *)0x0;
  }
  else {
    __dest = (void *)((long)&__dest_00->keyLen + uVar17);
    pkVar8->value = __dest;
    memcpy(__dest,value,(ulong)valueLen);
    __dest_00 = (ktxHashList)pkVar8->key;
    sVar7 = (size_t)(pkVar8->keyLen - 1);
  }
  pUVar14 = &pkVar8->hh;
  (pkVar8->hh).next = (void *)0x0;
  (pkVar8->hh).key = __dest_00;
  uVar21 = (uint)sVar7;
  (pkVar8->hh).keylen = uVar21;
  if (*pHead == (ktxHashList)0x0) {
    *pHead = pkVar8;
    (pkVar8->hh).prev = (void *)0x0;
    pUVar9 = (UT_hash_table *)calloc(1,0x40);
    (pkVar8->hh).tbl = pUVar9;
    if (pUVar9 == (UT_hash_table *)0x0) goto LAB_001b74a7;
    pUVar9->tail = pUVar14;
    pUVar9->num_buckets = 0x20;
    pUVar9->log2_num_buckets = 5;
    pUVar9->hho = 0x20;
    pUVar10 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar9->buckets = pUVar10;
    if (pUVar10 == (UT_hash_bucket *)0x0) goto LAB_001b74a7;
    pUVar9->signature = 0xa0111fe1;
    local_50 = pkVar8;
  }
  else {
    (((*pHead)->hh).tbl)->tail->next = pkVar8;
    pUVar9 = ((*pHead)->hh).tbl;
    (pkVar8->hh).prev = (void *)((long)pUVar9->tail - pUVar9->hho);
    pUVar9->tail = pUVar14;
    pUVar9 = ((*pHead)->hh).tbl;
    local_50 = *pHead;
  }
  uVar13 = pUVar9->num_items + 1;
  pUVar9->num_items = uVar13;
  (pkVar8->hh).tbl = pUVar9;
  (pkVar8->hh).hashv = 0xfeedbeef;
  pbVar20 = (byte *)((long)&__dest_00->key + 3);
  uVar19 = 0x9e3779b9;
  uVar5 = 0xfeedbeef;
  uVar12 = 0x9e3779b9;
  while (uVar6 = (uint)sVar7, 0xb < uVar6) {
    iVar11 = uVar19 + (int)(char)pbVar20[-7] + (char)pbVar20[-6] * 0x100 +
             (uint)pbVar20[-4] * 0x1000000 + (char)pbVar20[-5] * 0x10000;
    uVar19 = (char)pbVar20[-1] * 0x10000 + uVar5 +
             (char)pbVar20[-2] * 0x100 + (int)(char)pbVar20[-3] + (uint)*pbVar20 * 0x1000000;
    uVar5 = uVar19 >> 0xd ^
            ((uVar12 + (int)(char)pbVar20[-0xb] + (char)pbVar20[-10] * 0x100 +
             (uint)pbVar20[-8] * 0x1000000 + (char)pbVar20[-9] * 0x10000) - iVar11) - uVar19;
    uVar12 = uVar5 << 8 ^ (iVar11 - uVar19) - uVar5;
    uVar19 = uVar12 >> 0xd ^ (uVar19 - uVar5) - uVar12;
    uVar15 = uVar19 >> 0xc ^ (uVar5 - uVar12) - uVar19;
    uVar5 = uVar15 << 0x10 ^ (uVar12 - uVar19) - uVar15;
    uVar16 = uVar5 >> 5 ^ (uVar19 - uVar15) - uVar5;
    uVar12 = uVar16 >> 3 ^ (uVar15 - uVar5) - uVar16;
    uVar19 = uVar12 << 10 ^ (uVar5 - uVar16) - uVar12;
    uVar5 = uVar19 >> 0xf ^ (uVar16 - uVar12) - uVar19;
    (pkVar8->hh).hashv = uVar5;
    pbVar20 = pbVar20 + 0xc;
    sVar7 = (size_t)(uVar6 - 0xc);
  }
  uVar5 = uVar5 + uVar21;
  (pkVar8->hh).hashv = uVar5;
  switch(uVar6) {
  case 1:
    goto LAB_001b72b9;
  case 2:
    goto LAB_001b72ac;
  case 3:
    goto LAB_001b729f;
  case 4:
    goto LAB_001b7292;
  case 5:
    goto LAB_001b7288;
  case 6:
    goto LAB_001b727b;
  case 7:
    goto LAB_001b726e;
  case 8:
    break;
  case 0xb:
    uVar5 = (uint)pbVar20[-1] * 0x1000000 + uVar5;
    (pkVar8->hh).hashv = uVar5;
  case 10:
    uVar5 = (char)pbVar20[-2] * 0x10000 + uVar5;
    (pkVar8->hh).hashv = uVar5;
  case 9:
    uVar5 = (char)pbVar20[-3] * 0x100 + uVar5;
    (pkVar8->hh).hashv = uVar5;
    break;
  default:
    goto switchD_001b71e0_default;
  }
  uVar19 = (uint)pbVar20[-4] * 0x1000000 + uVar19;
LAB_001b726e:
  uVar19 = (char)pbVar20[-5] * 0x10000 + uVar19;
LAB_001b727b:
  uVar19 = (char)pbVar20[-6] * 0x100 + uVar19;
LAB_001b7288:
  uVar19 = (int)(char)pbVar20[-7] + uVar19;
LAB_001b7292:
  uVar12 = (uint)pbVar20[-8] * 0x1000000 + uVar12;
LAB_001b729f:
  uVar12 = (char)pbVar20[-9] * 0x10000 + uVar12;
LAB_001b72ac:
  uVar12 = (char)pbVar20[-10] * 0x100 + uVar12;
LAB_001b72b9:
  uVar12 = (int)(char)pbVar20[-0xb] + uVar12;
switchD_001b71e0_default:
  uVar21 = uVar5 >> 0xd ^ (uVar12 - uVar19) - uVar5;
  uVar19 = uVar21 << 8 ^ (uVar19 - uVar5) - uVar21;
  uVar5 = uVar19 >> 0xd ^ (uVar5 - uVar21) - uVar19;
  uVar12 = uVar5 >> 0xc ^ (uVar21 - uVar19) - uVar5;
  uVar21 = uVar12 << 0x10 ^ (uVar19 - uVar5) - uVar12;
  uVar19 = uVar21 >> 5 ^ (uVar5 - uVar12) - uVar21;
  uVar5 = uVar19 >> 3 ^ (uVar12 - uVar21) - uVar19;
  uVar21 = uVar5 << 10 ^ (uVar21 - uVar19) - uVar5;
  uVar21 = uVar21 >> 0xf ^ uVar19 - (uVar5 + uVar21);
  (pkVar8->hh).hashv = uVar21;
  pUVar2 = (local_50->hh).tbl;
  uVar21 = pUVar2->num_buckets - 1 & uVar21;
  pUVar10 = pUVar2->buckets;
  pUVar10[uVar21].count = pUVar10[uVar21].count + 1;
  pUVar18 = pUVar10[uVar21].hh_head;
  (pkVar8->hh).hh_next = pUVar18;
  (pkVar8->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar18 != (UT_hash_handle *)0x0) {
    pUVar18->hh_prev = pUVar14;
    pUVar10 = (((*pHead)->hh).tbl)->buckets;
  }
  pUVar10[uVar21].hh_head = pUVar14;
  pUVar10 = (((*pHead)->hh).tbl)->buckets;
  if ((pUVar10[uVar21].expand_mult * 10 + 10 <= pUVar10[uVar21].count) && (pUVar9->noexpand != 1)) {
    uVar21 = pUVar9->num_buckets;
    uVar5 = uVar21 * 2;
    pUVar10 = (UT_hash_bucket *)calloc(1,(ulong)uVar5 << 4);
    if (pUVar10 == (UT_hash_bucket *)0x0) {
LAB_001b74a7:
      exit(-1);
    }
    uVar19 = pUVar9->log2_num_buckets + 1;
    uVar12 = ((uVar13 >> ((byte)uVar19 & 0x1f)) + 1) - (uint)((uVar5 - 1 & uVar13) == 0);
    pUVar9->ideal_chain_maxlen = uVar12;
    pUVar9->nonideal_items = 0;
    uVar13 = 0;
    for (uVar17 = 0; uVar17 != uVar21; uVar17 = uVar17 + 1) {
      pUVar18 = pUVar9->buckets[uVar17].hh_head;
      while (pUVar18 != (UT_hash_handle *)0x0) {
        pUVar3 = pUVar18->hh_next;
        uVar15 = pUVar18->hashv & uVar5 - 1;
        pUVar1 = pUVar10 + uVar15;
        uVar6 = pUVar10[uVar15].count + 1;
        pUVar10[uVar15].count = uVar6;
        if (uVar12 < uVar6) {
          uVar13 = uVar13 + 1;
          pUVar9->nonideal_items = uVar13;
          pUVar1->expand_mult = uVar6 / uVar12;
        }
        pUVar18->hh_prev = (UT_hash_handle *)0x0;
        pUVar4 = pUVar1->hh_head;
        pUVar18->hh_next = pUVar4;
        if (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar4->hh_prev = pUVar18;
        }
        pUVar1->hh_head = pUVar18;
        pUVar18 = pUVar3;
      }
    }
    pUVar9->num_buckets = uVar5;
    pUVar9->log2_num_buckets = uVar19;
    free(pUVar9->buckets);
    pUVar9 = pUVar14->tbl;
    pUVar9->buckets = pUVar10;
    if (pUVar9->num_items >> 1 < pUVar9->nonideal_items) {
      uVar21 = pUVar9->ineff_expands + 1;
      pUVar9->ineff_expands = uVar21;
      if (1 < uVar21) {
        pUVar9->noexpand = 1;
      }
    }
    else {
      pUVar9->ineff_expands = 0;
    }
  }
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
ktxHashList_AddKVPair(ktxHashList* pHead, const char* key, unsigned int valueLen, const void* value)
{
    if (pHead && key && (valueLen == 0 || value)) {
        unsigned int keyLen = (unsigned int)strlen(key) + 1;
        ktxKVListEntry* kv;

        if (keyLen == 1)
            return KTX_INVALID_VALUE;   /* Empty string */

        /* Allocate all the memory as a block */
        kv = (ktxKVListEntry*)malloc(sizeof(ktxKVListEntry) + keyLen + valueLen);
        /* Put key first */
        kv->key = (char *)kv + sizeof(ktxKVListEntry);
        kv->keyLen = keyLen;
        memcpy(kv->key, key, keyLen);
        /* then value */
        kv->valueLen = valueLen;
        if (valueLen > 0) {
            kv->value = kv->key + keyLen;
            memcpy(kv->value, value, valueLen);
        } else {
            kv->value = 0;
        }

        HASH_ADD_KEYPTR( hh, *pHead, kv->key, kv->keyLen-1, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}